

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O1

int BN_from_montgomery_word(BIGNUM *ret,BIGNUM *r,BN_MONT_CTX *mont)

{
  uint num;
  int iVar1;
  ulong *ap;
  unsigned_long uVar2;
  ulong *rp;
  unsigned_long *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int words;
  BIGNUM *pBVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  uint uVar13;
  long lVar14;
  
  num = (mont->N).top;
  lVar14 = (long)(int)num;
  if (lVar14 == 0) {
    ret->top = 0;
  }
  else {
    words = num * 2;
    pBVar7 = bn_wexpand(r,words);
    if (pBVar7 == (BIGNUM *)0x0) {
      return 0;
    }
    uVar8 = (ulong)num;
    r->neg = r->neg ^ (mont->N).neg;
    ap = (mont->N).d;
    puVar12 = r->d;
    iVar1 = r->top;
    if (words != iVar1) {
      memset(puVar12 + iVar1,0,(long)(words - iVar1) << 3);
    }
    r->top = words;
    if ((int)num < 1) {
      uVar11 = 0;
    }
    else {
      uVar2 = mont->n0[0];
      uVar11 = 0;
      uVar13 = num;
      do {
        uVar9 = bn_mul_add_words(puVar12,ap,num,*puVar12 * uVar2);
        uVar10 = uVar9 + uVar11 + puVar12[uVar8];
        uVar11 = (ulong)(((byte)uVar11 | uVar9 + uVar11 != 0) & uVar10 <= puVar12[uVar8]);
        puVar12[uVar8] = uVar10;
        puVar12 = puVar12 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    pBVar7 = bn_wexpand(ret,num);
    if (pBVar7 == (BIGNUM *)0x0) {
      return 0;
    }
    ret->top = num;
    ret->neg = r->neg;
    rp = ret->d;
    puVar3 = r->d;
    puVar12 = puVar3 + lVar14;
    uVar10 = bn_sub_words(rp,puVar12,ap,num);
    uVar11 = ((ulong)puVar12 ^ (ulong)rp) & uVar11 - uVar10 ^ (ulong)rp;
    uVar10 = 0;
    if (4 < (int)num) {
      uVar10 = 0;
      do {
        uVar9 = *(ulong *)(uVar11 + uVar10 * 8);
        uVar4 = *(ulong *)(uVar11 + 8 + uVar10 * 8);
        uVar5 = *(ulong *)(uVar11 + 0x10 + uVar10 * 8);
        puVar3[lVar14 + uVar10] = 0;
        uVar6 = *(ulong *)(uVar11 + 0x18 + uVar10 * 8);
        puVar3[lVar14 + uVar10 + 1] = 0;
        rp[uVar10] = uVar9;
        puVar3[lVar14 + uVar10 + 2] = 0;
        rp[uVar10 + 1] = uVar4;
        puVar3[lVar14 + uVar10 + 3] = 0;
        rp[uVar10 + 2] = uVar5;
        rp[uVar10 + 3] = uVar6;
        uVar10 = uVar10 + 4;
      } while ((long)uVar10 < lVar14 + -4);
    }
    if ((int)uVar10 < (int)num) {
      uVar10 = uVar10 & 0xffffffff;
      do {
        rp[uVar10] = *(ulong *)(uVar11 + uVar10 * 8);
        puVar12[uVar10] = 0;
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    bn_correct_top(r);
    bn_correct_top(ret);
  }
  return 1;
}

Assistant:

static int BN_from_montgomery_word(BIGNUM *ret, BIGNUM *r, BN_MONT_CTX *mont)
{
    BIGNUM *n;
    BN_ULONG *ap, *np, *rp, n0, v, carry;
    int nl, max, i;

    n = &(mont->N);
    nl = n->top;
    if (nl == 0) {
        ret->top = 0;
        return (1);
    }

    max = (2 * nl);             /* carry is stored separately */
    if (bn_wexpand(r, max) == NULL)
        return (0);

    r->neg ^= n->neg;
    np = n->d;
    rp = r->d;

    /* clear the top words of T */
    i = max - r->top;
    if (i)
        memset(&rp[r->top], 0, sizeof(*rp) * i);

    r->top = max;
    n0 = mont->n0[0];

    for (carry = 0, i = 0; i < nl; i++, rp++) {
        v = bn_mul_add_words(rp, np, nl, (rp[0] * n0) & BN_MASK2);
        v = (v + carry + rp[nl]) & BN_MASK2;
        carry |= (v != rp[nl]);
        carry &= (v <= rp[nl]);
        rp[nl] = v;
    }

    if (bn_wexpand(ret, nl) == NULL)
        return (0);
    ret->top = nl;
    ret->neg = r->neg;

    rp = ret->d;
    ap = &(r->d[nl]);

# define BRANCH_FREE 1
# if BRANCH_FREE
    {
        BN_ULONG *nrp;
        size_t m;

        v = bn_sub_words(rp, ap, np, nl) - carry;
        /*
         * if subtraction result is real, then trick unconditional memcpy
         * below to perform in-place "refresh" instead of actual copy.
         */
        m = (0 - (size_t)v);
        nrp =
            (BN_ULONG *)(((PTR_SIZE_INT) rp & ~m) | ((PTR_SIZE_INT) ap & m));

        for (i = 0, nl -= 4; i < nl; i += 4) {
            BN_ULONG t1, t2, t3, t4;

            t1 = nrp[i + 0];
            t2 = nrp[i + 1];
            t3 = nrp[i + 2];
            ap[i + 0] = 0;
            t4 = nrp[i + 3];
            ap[i + 1] = 0;
            rp[i + 0] = t1;
            ap[i + 2] = 0;
            rp[i + 1] = t2;
            ap[i + 3] = 0;
            rp[i + 2] = t3;
            rp[i + 3] = t4;
        }
        for (nl += 4; i < nl; i++)
            rp[i] = nrp[i], ap[i] = 0;
    }
# else
    if (bn_sub_words(rp, ap, np, nl) - carry)
        memcpy(rp, ap, nl * sizeof(BN_ULONG));
# endif
    bn_correct_top(r);
    bn_correct_top(ret);
    bn_check_top(ret);

    return (1);
}